

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

gamewin * alloc_gamewin(wchar_t extra)

{
  gamewin *pgVar1;
  gamewin *__s;
  gamewin *gw;
  wchar_t extra_local;
  
  __s = (gamewin *)malloc((long)extra + 0x28);
  memset(__s,0,(long)extra + 0x28);
  if ((firstgw != (gamewin *)0x0) || (pgVar1 = __s, lastgw != (gamewin *)0x0)) {
    lastgw->next = __s;
    __s->prev = lastgw;
    pgVar1 = firstgw;
  }
  firstgw = pgVar1;
  lastgw = __s;
  return __s;
}

Assistant:

struct gamewin *alloc_gamewin(int extra)
{
    struct gamewin *gw = malloc(sizeof(struct gamewin) + extra);
    memset(gw, 0, sizeof(struct gamewin) + extra);
    
    if (firstgw == NULL && lastgw == NULL)
	firstgw = lastgw = gw;
    else {
	lastgw->next = gw;
	gw->prev = lastgw;
	lastgw = gw;
    }
    
    return gw;
}